

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qibusproxy.cpp
# Opt level: O1

QIBusEngineDesc * __thiscall
QIBusProxy::getGlobalEngine(QIBusEngineDesc *__return_storage_ptr__,QIBusProxy *this)

{
  QString method;
  bool bVar1;
  QMetaType QVar2;
  PrivateShared *pPVar3;
  anon_union_24_3_e3d07ef4_for_data *paVar4;
  long in_FS_OFFSET;
  QDBusArgument argument;
  QDBusVariant t;
  QDBusPendingCall other;
  QDBusReply<QDBusVariant> reply;
  QDBusArgument in_stack_fffffffffffffef8;
  QMetaType in_stack_ffffffffffffff00;
  InterfaceType *pIVar5;
  undefined8 in_stack_ffffffffffffff08;
  InterfaceType *pIVar6;
  anon_union_24_3_e3d07ef4_for_data local_d8;
  ulong uStack_c0;
  undefined1 local_b8 [24];
  ulong uStack_a0;
  undefined1 local_98 [8];
  QArrayData *pQStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  QArrayData *local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  anon_union_24_3_e3d07ef4_for_data local_58;
  undefined8 uStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  memset(__return_storage_ptr__,0xaa,0x1a8);
  QIBusEngineDesc::QIBusEngineDesc(__return_storage_ptr__);
  local_58._16_8_ = 0xaaaaaaaaaaaaaaaa;
  uStack_40 = 0xaaaaaaaaaaaaaaaa;
  local_58.shared = (PrivateShared *)0xaaaaaaaaaaaaaaaa;
  local_58._8_8_ = 0xaaaaaaaaaaaaaaaa;
  local_68 = 0xaaaaaaaaaaaaaaaa;
  uStack_60 = 0xaaaaaaaaaaaaaaaa;
  local_78 = (QArrayData *)0xaaaaaaaaaaaaaaaa;
  uStack_70 = 0xaaaaaaaaaaaaaaaa;
  local_88 = 0xaaaaaaaaaaaaaaaa;
  uStack_80 = 0xaaaaaaaaaaaaaaaa;
  local_98 = (undefined1  [8])0xaaaaaaaaaaaaaaaa;
  pQStack_90 = (QArrayData *)0xaaaaaaaaaaaaaaaa;
  local_b8._0_8_ = (QArrayData *)0x0;
  local_b8._8_8_ = L"GlobalEngine";
  local_b8._16_8_ = 0xc;
  method.d.ptr = (char16_t *)in_stack_ffffffffffffff00.d_ptr;
  method.d.d = (Data *)in_stack_fffffffffffffef8.d;
  method.d.size = in_stack_ffffffffffffff08;
  GetProperty((QIBusProxy *)&stack0xffffffffffffff08,method);
  if ((QArrayData *)local_b8._0_8_ != (QArrayData *)0x0) {
    LOCK();
    *(int *)local_b8._0_8_ = *(int *)local_b8._0_8_ + -1;
    UNLOCK();
    if (*(int *)local_b8._0_8_ == 0) {
      QArrayData::deallocate((QArrayData *)local_b8._0_8_,2,0x10);
    }
  }
  QDBusError::QDBusError((QDBusError *)local_98);
  local_58.shared = (PrivateShared *)0x0;
  local_58._8_8_ = 0;
  local_58._16_8_ = 0;
  uStack_40 = 2;
  local_b8._0_8_ = (PrivateShared *)0xaaaaaaaaaaaaaaaa;
  QDBusPendingCall::QDBusPendingCall
            ((QDBusPendingCall *)local_b8,(QDBusPendingCall *)&stack0xffffffffffffff08);
  QDBusPendingCall::waitForFinished();
  QDBusPendingCall::reply();
  QDBusReply<QDBusVariant>::operator=
            ((QDBusReply<QDBusVariant> *)local_98,(QDBusMessage *)local_d8.data);
  QDBusMessage::~QDBusMessage((QDBusMessage *)local_d8.data);
  QDBusPendingCall::~QDBusPendingCall((QDBusPendingCall *)local_b8);
  QDBusPendingCall::~QDBusPendingCall((QDBusPendingCall *)&stack0xffffffffffffff08);
  local_b8._16_8_ = 0xaaaaaaaaaaaaaaaa;
  uStack_a0 = 0xaaaaaaaaaaaaaaaa;
  local_b8._0_8_ = (PrivateShared *)0xaaaaaaaaaaaaaaaa;
  local_b8._8_8_ = 0xaaaaaaaaaaaaaaaa;
  QVariant::QVariant((QVariant *)&local_d8,(QVariant *)&local_58);
  pPVar3 = (PrivateShared *)local_b8;
  QVariant::QVariant((QVariant *)pPVar3,(QVariant *)&local_d8);
  QVariant::~QVariant((QVariant *)&local_d8);
  if (3 < uStack_a0) {
    local_d8._16_8_ = 0xaaaaaaaaaaaaaaaa;
    uStack_c0 = 0xaaaaaaaaaaaaaaaa;
    local_d8.shared = (PrivateShared *)0xaaaaaaaaaaaaaaaa;
    local_d8._8_8_ = 0xaaaaaaaaaaaaaaaa;
    pIVar5 = &QtPrivate::QMetaTypeInterfaceWrapper<QDBusVariant>::metaType;
    bVar1 = comparesEqual((QMetaType *)&stack0xffffffffffffff08,
                          (QMetaType *)&stack0xffffffffffffff00);
    if (bVar1) {
      if ((uStack_a0 & 1) == 0) {
        pPVar3 = (PrivateShared *)local_b8;
      }
      else {
        pPVar3 = (PrivateShared *)(local_b8._0_8_ + (long)*(int *)(local_b8._0_8_ + 4));
      }
      QVariant::QVariant((QVariant *)&stack0xffffffffffffff08,(QVariant *)pPVar3);
    }
    else {
      QVar2.d_ptr = (QMetaTypeInterface *)QVariant::metaType();
      if ((uStack_a0 & 1) != 0) {
        pPVar3 = (PrivateShared *)(local_b8._0_8_ + (long)*(int *)(local_b8._0_8_ + 4));
      }
      QMetaType::convert(QVar2,pPVar3,(QMetaType)pIVar5,&stack0xffffffffffffff08);
    }
    paVar4 = &local_d8;
    QVariant::QVariant((QVariant *)paVar4,(QVariant *)&stack0xffffffffffffff08);
    QVariant::~QVariant((QVariant *)&stack0xffffffffffffff08);
    if (3 < uStack_c0) {
      pIVar6 = &QtPrivate::QMetaTypeInterfaceWrapper<QDBusArgument>::metaType;
      bVar1 = comparesEqual((QMetaType *)&stack0xffffffffffffff00,
                            (QMetaType *)&stack0xffffffffffffff08);
      if (bVar1) {
        if ((uStack_c0 & 1) == 0) {
          paVar4 = &local_d8;
        }
        else {
          paVar4 = (anon_union_24_3_e3d07ef4_for_data *)
                   (local_d8.shared + *(int *)(local_d8.shared + 4));
        }
        QDBusArgument::QDBusArgument
                  ((QDBusArgument *)&stack0xfffffffffffffef8,(QDBusArgument *)&paVar4->shared);
      }
      else {
        QDBusArgument::QDBusArgument((QDBusArgument *)&stack0xfffffffffffffef8);
        QVar2.d_ptr = (QMetaTypeInterface *)QVariant::metaType();
        if ((uStack_c0 & 1) != 0) {
          paVar4 = (anon_union_24_3_e3d07ef4_for_data *)
                   (local_d8.shared + *(int *)(local_d8.shared + 4));
        }
        QMetaType::convert(QVar2,paVar4,(QMetaType)pIVar6,&stack0xfffffffffffffef8);
      }
      QIBusEngineDesc::deserializeFrom
                (__return_storage_ptr__,(QDBusArgument *)&stack0xfffffffffffffef8);
      QDBusArgument::~QDBusArgument((QDBusArgument *)&stack0xfffffffffffffef8);
    }
    QVariant::~QVariant((QVariant *)&local_d8);
  }
  QVariant::~QVariant((QVariant *)local_b8);
  QVariant::~QVariant((QVariant *)&local_58);
  if (local_78 != (QArrayData *)0x0) {
    LOCK();
    (local_78->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_78->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_78->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_78,2,0x10);
    }
  }
  if (pQStack_90 != (QArrayData *)0x0) {
    LOCK();
    (pQStack_90->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQStack_90->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQStack_90->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQStack_90,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QIBusEngineDesc QIBusProxy::getGlobalEngine()
{
    QIBusEngineDesc desc;
    QDBusReply<QDBusVariant> reply = GlobalEngine();
    QVariant variant = reply.value().variant();
    if (!variant.isValid())
        return desc;
    QVariant child = qvariant_cast<QDBusVariant>(variant).variant();
    if (!child.isValid())
        return desc;
    const QDBusArgument argument = qvariant_cast<QDBusArgument>(child);
    argument >> desc;
    return desc;
}